

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

long __thiscall
wasm::Random::
pickGivenNum<long,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,size_t num,long first,short args,int args_1,int args_2,long args_3,
          long args_4,uchar args_5,unsigned_short args_6,uint args_7,unsigned_long args_8)

{
  if (num != 0) {
    if (num == 1) {
      first = (long)args;
    }
    else if (num == 2) {
      first = (long)args_1;
    }
    else if (num == 3) {
      first = (long)args_2;
    }
    else {
      first = args_3;
      if (num != 4) {
        first = pickGivenNum<long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                          (this,num - 5,args_4,args_5,args_6,args_7,args_8);
      }
    }
  }
  return first;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }